

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DT_TriEdge.cpp
# Opt level: O2

bool __thiscall
sch::Depth_Edge::silhouette
          (Depth_Edge *this,Vector3 *verts,Index_t index,Depth_TriangleStore *triangleStore)

{
  int iVar1;
  bool bVar2;
  bool bVar3;
  Depth_Triangle *pDVar4;
  Depth_Edge local_40;
  
  bVar3 = true;
  if (this->m_triangle->m_obsolete == false) {
    bVar2 = Depth_Triangle::isVisibleFrom(this->m_triangle,verts,index);
    pDVar4 = this->m_triangle;
    if (bVar2) {
      pDVar4->m_obsolete = true;
      iVar1 = triangleStore->m_free;
      bVar2 = silhouette(pDVar4->m_adjEdges + (this->m_index + 1) % 3,verts,index,triangleStore);
      pDVar4 = this->m_triangle;
      if (bVar2) {
        bVar2 = silhouette(pDVar4->m_adjEdges + (this->m_index + 2) % 3,verts,index,triangleStore);
        if (bVar2) {
          return true;
        }
        pDVar4 = this->m_triangle;
        pDVar4->m_obsolete = false;
        triangleStore->m_free = iVar1;
      }
      else {
        pDVar4->m_obsolete = false;
      }
      iVar1 = this->m_index;
    }
    else {
      iVar1 = this->m_index;
    }
    local_40.m_triangle =
         Depth_TriangleStore::newTriangle
                   (triangleStore,verts,index,pDVar4->m_indices[(iVar1 + 1) % 3],
                    pDVar4->m_indices[iVar1]);
    if (local_40.m_triangle == (Depth_Triangle *)0x0) {
      bVar3 = false;
    }
    else {
      local_40.m_index = 1;
      half_link(&local_40,this);
    }
  }
  return bVar3;
}

Assistant:

bool Depth_Edge::silhouette(const Vector3 * verts, Index_t index, Depth_TriangleStore & triangleStore) const
{
  if(!m_triangle->isObsolete())
  {
    if(!m_triangle->isVisibleFrom(verts, index))
    {
      Depth_Triangle * triangle = triangleStore.newTriangle(verts, index, getTarget(), getSource());

      if(triangle)
      {
        half_link(Depth_Edge(triangle, 1), *this);
        return true;
      }

      return false;
    }
    else
    {
      m_triangle->setObsolete(true); // Triangle is visible

      int backup = triangleStore.getFree();

      if(!m_triangle->getAdjEdge(circ_next(m_index)).silhouette(verts, index, triangleStore))
      {
        m_triangle->setObsolete(false);

        Depth_Triangle * triangle = triangleStore.newTriangle(verts, index, getTarget(), getSource());

        if(triangle)
        {
          half_link(Depth_Edge(triangle, 1), *this);
          return true;
        }

        return false;
      }
      else if(!m_triangle->getAdjEdge(circ_prev(m_index)).silhouette(verts, index, triangleStore))
      {
        m_triangle->setObsolete(false);

        triangleStore.setFree(backup);

        Depth_Triangle * triangle = triangleStore.newTriangle(verts, index, getTarget(), getSource());

        if(triangle)
        {
          half_link(Depth_Edge(triangle, 1), *this);
          return true;
        }

        return false;
      }
    }
  }

  return true;
}